

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int isDupColumn(Index *pIdx,int nKey,Index *pPk,int iCol)

{
  short sVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  sVar1 = pPk->aiColumn[iCol];
  uVar4 = (ulong)(uint)nKey;
  if (nKey < 1) {
    uVar4 = 0;
  }
  uVar3 = 0;
  while( true ) {
    if (uVar4 == uVar3) {
      return 0;
    }
    if ((pIdx->aiColumn[uVar3] == sVar1) &&
       (iVar2 = sqlite3StrICmp(pIdx->azColl[uVar3],pPk->azColl[iCol]), iVar2 == 0)) break;
    uVar3 = uVar3 + 1;
  }
  return 1;
}

Assistant:

static int isDupColumn(Index *pIdx, int nKey, Index *pPk, int iCol){
  int i, j;
  assert( nKey<=pIdx->nColumn );
  assert( iCol<MAX(pPk->nColumn,pPk->nKeyCol) );
  assert( pPk->idxType==SQLITE_IDXTYPE_PRIMARYKEY );
  assert( pPk->pTable->tabFlags & TF_WithoutRowid );
  assert( pPk->pTable==pIdx->pTable );
  testcase( pPk==pIdx );
  j = pPk->aiColumn[iCol];
  assert( j!=XN_ROWID && j!=XN_EXPR );
  for(i=0; i<nKey; i++){
    assert( pIdx->aiColumn[i]>=0 || j>=0 );
    if( pIdx->aiColumn[i]==j
     && sqlite3StrICmp(pIdx->azColl[i], pPk->azColl[iCol])==0
    ){
      return 1;
    }
  }
  return 0;
}